

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::slotReadBoard(Fifteen *this)

{
  Controller *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  string local_78;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  
  QString::QString((QString *)&local_a8,(char *)0x0);
  QString::QString((QString *)&local_90,"");
  QDir::currentPath();
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QFileDialog::getOpenFileName(&local_78,this,&local_90,&local_50,&local_38,0,0);
  qVar3 = local_a8.size;
  pcVar2 = local_a8.ptr;
  pDVar1 = local_a8.d;
  local_a8.d = (Data *)local_78._M_dataplus._M_p;
  local_a8.ptr = (char16_t *)local_78._M_string_length;
  local_78._M_dataplus._M_p = (pointer)pDVar1;
  local_78._M_string_length = (size_type)pcVar2;
  local_a8.size = local_78.field_2._M_allocated_capacity;
  local_78.field_2._M_allocated_capacity = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  if (local_a8.size != 0) {
    this_00 = (this->controller)._M_t.
              super___uniq_ptr_impl<Controller,_std::default_delete<Controller>_>._M_t.
              super__Tuple_impl<0UL,_Controller_*,_std::default_delete<Controller>_>.
              super__Head_base<0UL,_Controller_*,_false>._M_head_impl;
    QString::toStdString_abi_cxx11_(&local_78,(QString *)&local_a8);
    bVar4 = Controller::readBoardFromFile(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar4) {
      redrawTiles(this);
    }
    else {
      QString::QString((QString *)&local_78,"");
      Message::getMessages();
      QMessageBox::information(this,&local_78,&local_90,0x400,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  return;
}

Assistant:

void Fifteen::slotReadBoard()
{    
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath() );
         file.isEmpty() )
    {
        return;
    }

    if ( controller->readBoardFromFile( file.toStdString() ) == false)
    {
        QMessageBox::information( this, "", Message::getMessages() );
        return;
    }
    redrawTiles();
}